

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddConstantTable
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  Var var;
  RegSlot location;
  uint32 uVar6;
  
  uVar6 = 0;
  location = 2;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    RVar3 = FunctionBody::GetConstantCount(function);
    if (RVar3 <= location) {
      return uVar6;
    }
    var = FunctionBody::GetConstantVar(function,location);
    if (var == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x673,"(var != nullptr)","var != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    uVar4 = PrependVarConstant(this,builder,var);
    uVar6 = uVar6 + uVar4;
    location = location + 1;
  } while( true );
}

Assistant:

uint32 AddConstantTable(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start Constant Table"), magicStartOfConstantTable);
#endif

        for (auto reg = FunctionBody::FirstRegSlot + 1; reg < function->GetConstantCount(); reg++) // Ignore first slot, it is always global object or module root object
        {
            auto var = function->GetConstantVar(reg);
            Assert(var != nullptr);
            size += PrependVarConstant(builder, var);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Constant Table"), magicEndOfConstantTable);
#endif

        return size;
    }